

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::TypedExpectation<TestCallExprBuilder_(TestFunction,_int)>::TypedExpectation
          (TypedExpectation<TestCallExprBuilder_(TestFunction,_int)> *this,
          FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)> *owner,char *a_file,int a_line
          ,string *a_source_text,ArgumentMatcherTuple *m)

{
  MatcherInterface<const_std::tuple<TestFunction,_int>_&> *pMVar1;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002fc978;
  this->owner_ = owner;
  std::_Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>::_Tuple_impl
            (&(this->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>,
             &m->super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>);
  pMVar1 = (MatcherInterface<const_std::tuple<TestFunction,_int>_&> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002fc9f8;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<TestFunction,_int>_&>.impl_.value_ =
       pMVar1;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<TestFunction,_int>_&>.impl_.link_.next_
       = &(this->extra_matcher_).super_MatcherBase<const_std::tuple<TestFunction,_int>_&>.impl_.
          link_;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<TestFunction,_int>_&>._vptr_MatcherBase
       = (_func_int **)&PTR__MatcherBase_002fc9c0;
  (this->repeated_action_).impl_.value_ =
       (ActionInterface<TestCallExprBuilder_(TestFunction,_int)> *)0x0;
  (this->repeated_action_).impl_.link_.next_ = &(this->repeated_action_).impl_.link_;
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}